

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ComputeUVMappingProcess.cpp
# Opt level: O3

void RemoveUVSeams(aiMesh *mesh,aiVector3D *out)

{
  float fVar1;
  uint uVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  uint uVar6;
  ulong uVar7;
  aiFace *paVar8;
  bool bVar9;
  ulong uVar10;
  uint uVar11;
  uint n;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  float fVar15;
  
  uVar11 = mesh->mNumFaces;
  if (uVar11 != 0) {
    uVar7 = 0;
    do {
      uVar2 = mesh->mFaces[uVar7].mNumIndices;
      uVar12 = (ulong)uVar2;
      if (2 < uVar12) {
        paVar8 = mesh->mFaces + uVar7;
        uVar13 = 0;
        bVar9 = false;
        bVar3 = false;
        bVar4 = false;
        uVar10 = uVar12;
        uVar14 = uVar2;
        do {
          fVar1 = out[paVar8->mIndices[uVar13]].x;
          bVar5 = true;
          if (0.01 < fVar1) {
            bVar5 = bVar4;
          }
          uVar6 = (uint)uVar13;
          if (0.1 <= fVar1) {
            uVar6 = uVar14;
            bVar5 = bVar4;
          }
          bVar4 = bVar5;
          uVar14 = uVar6;
          if (0.9 < fVar1) {
            if (0.99 <= fVar1) {
              bVar3 = true;
            }
            uVar10 = uVar13 & 0xffffffff;
          }
          bVar9 = (bool)(bVar9 | (fVar1 < 0.1 && 0.01 < fVar1));
          uVar13 = uVar13 + 1;
        } while (uVar12 != uVar13);
        if ((uVar14 != uVar2) && ((uint)uVar10 != uVar2)) {
          uVar12 = 0;
          do {
            fVar1 = out[paVar8->mIndices[uVar12]].x;
            if (((0.9 < fVar1) && (fVar15 = 0.0, !bVar4)) || (fVar15 = 1.0, fVar1 < 0.1 && !bVar3))
            goto LAB_003c6d7a;
            if ((bool)(bVar3 & bVar4)) {
              if (bVar9) {
                fVar15 = 0.0;
                if (0.99 <= fVar1) {
LAB_003c6d7a:
                  out[paVar8->mIndices[uVar12]].x = fVar15;
                }
              }
              else {
                fVar15 = 1.0;
                if (fVar1 <= 0.01) goto LAB_003c6d7a;
              }
            }
            uVar12 = uVar12 + 1;
          } while (uVar12 < paVar8->mNumIndices);
          uVar11 = mesh->mNumFaces;
        }
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 < uVar11);
  }
  return;
}

Assistant:

void RemoveUVSeams (aiMesh* mesh, aiVector3D* out)
{
    // TODO: just a very rough algorithm. I think it could be done
    // much easier, but I don't know how and am currently too tired to
    // to think about a better solution.

    const static ai_real LOWER_LIMIT = ai_real( 0.1 );
    const static ai_real UPPER_LIMIT = ai_real( 0.9 );

    const static ai_real LOWER_EPSILON = ai_real( 10e-3 );
    const static ai_real UPPER_EPSILON = ai_real( 1.0-10e-3 );

    for (unsigned int fidx = 0; fidx < mesh->mNumFaces;++fidx)
    {
        const aiFace& face = mesh->mFaces[fidx];
        if (face.mNumIndices < 3) continue; // triangles and polygons only, please

        unsigned int small = face.mNumIndices, large = small;
        bool zero = false, one = false, round_to_zero = false;

        // Check whether this face lies on a UV seam. We can just guess,
        // but the assumption that a face with at least one very small
        // on the one side and one very large U coord on the other side
        // lies on a UV seam should work for most cases.
        for (unsigned int n = 0; n < face.mNumIndices;++n)
        {
            if (out[face.mIndices[n]].x < LOWER_LIMIT)
            {
                small = n;

                // If we have a U value very close to 0 we can't
                // round the others to 0, too.
                if (out[face.mIndices[n]].x <= LOWER_EPSILON)
                    zero = true;
                else round_to_zero = true;
            }
            if (out[face.mIndices[n]].x > UPPER_LIMIT)
            {
                large = n;

                // If we have a U value very close to 1 we can't
                // round the others to 1, too.
                if (out[face.mIndices[n]].x >= UPPER_EPSILON)
                    one = true;
            }
        }
        if (small != face.mNumIndices && large != face.mNumIndices)
        {
            for (unsigned int n = 0; n < face.mNumIndices;++n)
            {
                // If the u value is over the upper limit and no other u
                // value of that face is 0, round it to 0
                if (out[face.mIndices[n]].x > UPPER_LIMIT && !zero)
                    out[face.mIndices[n]].x = 0.0;

                // If the u value is below the lower limit and no other u
                // value of that face is 1, round it to 1
                else if (out[face.mIndices[n]].x < LOWER_LIMIT && !one)
                    out[face.mIndices[n]].x = 1.0;

                // The face contains both 0 and 1 as UV coords. This can occur
                // for faces which have an edge that lies directly on the seam.
                // Due to numerical inaccuracies one U coord becomes 0, the
                // other 1. But we do still have a third UV coord to determine
                // to which side we must round to.
                else if (one && zero)
                {
                    if (round_to_zero && out[face.mIndices[n]].x >=  UPPER_EPSILON)
                        out[face.mIndices[n]].x = 0.0;
                    else if (!round_to_zero && out[face.mIndices[n]].x <= LOWER_EPSILON)
                        out[face.mIndices[n]].x = 1.0;
                }
            }
        }
    }
}